

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

void __thiscall CVmRun::check_prop_spec_eval(CVmRun *this,vm_obj_id_t obj,vm_prop_id_t prop)

{
  int iVar1;
  CVmObject *pCVar2;
  ushort in_DX;
  uint in_ESI;
  vm_obj_id_t srcobj;
  vm_val_t val;
  undefined1 local_24 [4];
  int local_20 [4];
  ushort local_e;
  uint local_c;
  
  local_e = in_DX;
  local_c = in_ESI;
  pCVar2 = vm_objp(0);
  iVar1 = (*pCVar2->_vptr_CVmObject[0xd])(pCVar2,(ulong)local_e,local_20,(ulong)local_c,local_24,0);
  if ((iVar1 != 0) &&
     ((((local_20[0] == 9 || (local_20[0] == 0xb)) || (local_20[0] == 0xe)) ||
      (local_20[0] == 0x11 || local_20[0] == 0x12)))) {
    err_throw(0);
  }
  return;
}

Assistant:

void CVmRun::check_prop_spec_eval(VMG_ vm_obj_id_t obj, vm_prop_id_t prop)
{
    vm_val_t val;
    vm_obj_id_t srcobj;

    /* get the property value */
    if (vm_objp(vmg_ obj)->get_prop(vmg_ prop, &val, obj, &srcobj, 0))
    {
        /* check the type of the value */
        switch(val.typ)
        {
        case VM_CODEOFS:
        case VM_OBJX:
        case VM_BIFPTRX:
        case VM_DSTRING:
        case VM_NATIVE_CODE:
            /* 
             *   evaulating these types could result in side effects, so
             *   this property cannot be evaulated during a speculative
             *   evaluation 
             */
            err_throw(VMERR_BAD_SPEC_EVAL);
            break;

        default:
            /* evaluating other types causes no side effects, so proceed */
            break;
        }
    }
}